

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

value_type __thiscall my_crc_basic::checksum(my_crc_basic *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (this->rft_out_ == true) {
    uVar2 = (ulong)this->width_;
    if (uVar2 == 0) {
      uVar1 = 0;
    }
    else {
      uVar3 = this->rem_;
      uVar1 = 0;
      do {
        uVar2 = uVar2 - 1;
        uVar1 = uVar1 | 1 << ((byte)uVar2 & 0x1f) & -(uVar3 & 1);
        uVar3 = uVar3 >> 1;
      } while (uVar2 != 0);
    }
  }
  else {
    uVar1 = this->rem_;
  }
  return (uVar1 ^ this->final_) & this->sig_bits;
}

Assistant:

my_crc_basic::value_type my_crc_basic::checksum() const {
  return ( (rft_out_ ? reflect( rem_ ) : rem_)
	   ^ final_ ) & sig_bits;
}